

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O3

void nn_sws_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  if (type != -3 || src != -2) {
    if (*(int *)&self[1].fn == 8) goto LAB_0012fbc7;
    nn_sws_shutdown_cold_1();
  }
  nn_pipebase_stop((nn_pipebase *)&self[0x3d].stopped.srcptr);
  nn_ws_handshake_stop((nn_ws_handshake *)&self[1].srcptr);
  *(undefined4 *)&self[1].fn = 8;
LAB_0012fbc7:
  nn_sws_shutdown_cold_2();
  return;
}

Assistant:

static void nn_sws_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_sws *sws;

    sws = nn_cont (self, struct nn_sws, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        /*  TODO: Consider sending a close code here? */
        nn_pipebase_stop (&sws->pipebase);
        nn_ws_handshake_stop (&sws->handshaker);
        sws->state = NN_SWS_STATE_STOPPING;
    }
    if (nn_slow (sws->state == NN_SWS_STATE_STOPPING)) {
        if (nn_ws_handshake_isidle (&sws->handshaker)) {
            nn_usock_swap_owner (sws->usock, &sws->usock_owner);
            sws->usock = NULL;
            sws->usock_owner.src = -1;
            sws->usock_owner.fsm = NULL;
            sws->state = NN_SWS_STATE_IDLE;
            nn_fsm_stopped (&sws->fsm, NN_SWS_RETURN_STOPPED);
            return;
        }
        return;
    }

    nn_fsm_bad_state (sws->state, src, type);
}